

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if (-2 < offset) {
    ppIVar1 = &GImGui->CurrentWindow;
    GImGui->FocusRequestNextWindow = *ppIVar1;
    pIVar2->FocusRequestNextCounterAll = ((*ppIVar1)->DC).FocusCounterAll + offset + 1;
    pIVar2->FocusRequestNextCounterTab = 0x7fffffff;
    return;
  }
  __assert_fail("offset >= -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0x1a68,"void ImGui::SetKeyboardFocusHere(int)");
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    g.FocusRequestNextWindow = window;
    g.FocusRequestNextCounterAll = window->DC.FocusCounterAll + 1 + offset;
    g.FocusRequestNextCounterTab = INT_MAX;
}